

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimulationIslandManager.cpp
# Opt level: O2

void __thiscall
btSimulationIslandManager::buildAndProcessIslands
          (btSimulationIslandManager *this,btDispatcher *dispatcher,btCollisionWorld *collisionWorld
          ,IslandCallback *callback)

{
  btElement *pbVar1;
  btPersistentManifold **ppbVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  int iVar6;
  btPersistentManifold **ppbVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  CProfileSample __profile;
  btCollisionObject *colObj0;
  ulong local_60;
  IslandCallback *local_58;
  btCollisionWorld *local_50;
  btAlignedObjectArray<btCollisionObject_*> *local_48;
  ulong local_40;
  long local_38;
  
  local_58 = callback;
  local_50 = collisionWorld;
  buildIslands(this,dispatcher,collisionWorld);
  iVar4 = (this->m_unionFind).m_elements.m_size;
  CProfileManager::Start_Profile("processIslands");
  if (this->m_splitIslands == false) {
    iVar4 = (*dispatcher->_vptr_btDispatcher[0xb])(dispatcher);
    uVar5 = (*dispatcher->_vptr_btDispatcher[9])(dispatcher);
    (*local_58->_vptr_IslandCallback[2])
              (local_58,(local_50->m_collisionObjects).m_data,
               (ulong)(uint)(local_50->m_collisionObjects).m_size,CONCAT44(extraout_var,iVar4),
               (ulong)uVar5,0xffffffffffffffff);
  }
  else {
    iVar6 = (this->m_islandmanifold).m_size;
    btAlignedObjectArray<btPersistentManifold_*>::quickSort<btPersistentManifoldSortPredicate>
              (&this->m_islandmanifold,(btPersistentManifoldSortPredicate *)&colObj0);
    local_38 = (long)iVar4;
    local_48 = &this->m_islandBodies;
    uVar13 = 1;
    uVar9 = 0;
    iVar8 = 0;
    local_40 = (long)iVar6;
    while (iVar8 < iVar4) {
      lVar10 = (long)iVar8;
      uVar5 = (this->m_unionFind).m_elements.m_data[lVar10].m_id;
      bVar11 = true;
      local_60 = uVar9;
      for (; (iVar6 = iVar4, local_38 != lVar10 &&
             (pbVar1 = (this->m_unionFind).m_elements.m_data, iVar6 = iVar8,
             pbVar1[lVar10].m_id == uVar5)); lVar10 = lVar10 + 1) {
        colObj0 = (local_50->m_collisionObjects).m_data[pbVar1[lVar10].m_sz];
        btAlignedObjectArray<btCollisionObject_*>::push_back(local_48,&colObj0);
        bVar11 = (bool)(bVar11 & (colObj0->m_activationState1 == 5 ||
                                 colObj0->m_activationState1 == 2));
        iVar8 = iVar8 + 1;
      }
      iVar8 = iVar6;
      iVar6 = (int)local_60;
      if (iVar6 < (int)local_40) {
        ppbVar2 = (this->m_islandmanifold).m_data;
        lVar10 = (long)iVar6;
        uVar3 = ppbVar2[lVar10]->m_body0->m_islandTag1;
        if ((int)uVar3 < 0) {
          uVar3 = ppbVar2[lVar10]->m_body1->m_islandTag1;
        }
        if (uVar3 != uVar5) goto LAB_0014a263;
        ppbVar7 = ppbVar2 + lVar10;
        uVar9 = (ulong)(iVar6 + 1U);
        if ((int)(iVar6 + 1U) < (int)local_40) {
          uVar9 = local_40 & 0xffffffff;
        }
        uVar12 = local_60 & 0xffffffff;
        do {
          lVar10 = lVar10 + 1;
          uVar13 = uVar9;
          if ((long)local_40 <= lVar10) break;
          uVar3 = ppbVar2[lVar10]->m_body0->m_islandTag1;
          if ((int)uVar3 < 0) {
            uVar3 = ppbVar2[lVar10]->m_body1->m_islandTag1;
          }
          uVar12 = (ulong)((int)uVar12 + 1);
          uVar13 = uVar12;
        } while (uVar5 == uVar3);
        uVar3 = (int)uVar13 - iVar6;
      }
      else {
LAB_0014a263:
        uVar3 = 0;
        ppbVar7 = (btPersistentManifold **)0x0;
      }
      if (!bVar11) {
        (*local_58->_vptr_IslandCallback[2])
                  (local_58,(this->m_islandBodies).m_data,(ulong)(uint)(this->m_islandBodies).m_size
                   ,ppbVar7,(ulong)uVar3,(ulong)uVar5);
      }
      colObj0 = (btCollisionObject *)0x0;
      btAlignedObjectArray<btCollisionObject_*>::resize(local_48,0,&colObj0);
      uVar9 = local_60;
      if (uVar3 != 0) {
        uVar9 = uVar13;
      }
      uVar9 = uVar9 & 0xffffffff;
    }
  }
  CProfileSample::~CProfileSample(&__profile);
  return;
}

Assistant:

void btSimulationIslandManager::buildAndProcessIslands(btDispatcher* dispatcher,btCollisionWorld* collisionWorld, IslandCallback* callback)
{
	btCollisionObjectArray& collisionObjects = collisionWorld->getCollisionObjectArray();

	buildIslands(dispatcher,collisionWorld);

	int endIslandIndex=1;
	int startIslandIndex;
	int numElem = getUnionFind().getNumElements();

	BT_PROFILE("processIslands");

	if(!m_splitIslands)
	{
		btPersistentManifold** manifold = dispatcher->getInternalManifoldPointer();
		int maxNumManifolds = dispatcher->getNumManifolds();
		callback->processIsland(&collisionObjects[0],collisionObjects.size(),manifold,maxNumManifolds, -1);
	}
	else
	{
		// Sort manifolds, based on islands
		// Sort the vector using predicate and std::sort
		//std::sort(islandmanifold.begin(), islandmanifold.end(), btPersistentManifoldSortPredicate);

		int numManifolds = int (m_islandmanifold.size());

		//tried a radix sort, but quicksort/heapsort seems still faster
		//@todo rewrite island management
		m_islandmanifold.quickSort(btPersistentManifoldSortPredicate());
		//m_islandmanifold.heapSort(btPersistentManifoldSortPredicate());

		//now process all active islands (sets of manifolds for now)

		int startManifoldIndex = 0;
		int endManifoldIndex = 1;

		//int islandId;

		

	//	printf("Start Islands\n");

		//traverse the simulation islands, and call the solver, unless all objects are sleeping/deactivated
		for ( startIslandIndex=0;startIslandIndex<numElem;startIslandIndex = endIslandIndex)
		{
			int islandId = getUnionFind().getElement(startIslandIndex).m_id;


			   bool islandSleeping = true;
	                
					for (endIslandIndex = startIslandIndex;(endIslandIndex<numElem) && (getUnionFind().getElement(endIslandIndex).m_id == islandId);endIslandIndex++)
					{
							int i = getUnionFind().getElement(endIslandIndex).m_sz;
							btCollisionObject* colObj0 = collisionObjects[i];
							m_islandBodies.push_back(colObj0);
							if (colObj0->isActive())
									islandSleeping = false;
					}
	                

			//find the accompanying contact manifold for this islandId
			int numIslandManifolds = 0;
			btPersistentManifold** startManifold = 0;

			if (startManifoldIndex<numManifolds)
			{
				int curIslandId = getIslandId(m_islandmanifold[startManifoldIndex]);
				if (curIslandId == islandId)
				{
					startManifold = &m_islandmanifold[startManifoldIndex];
				
					for (endManifoldIndex = startManifoldIndex+1;(endManifoldIndex<numManifolds) && (islandId == getIslandId(m_islandmanifold[endManifoldIndex]));endManifoldIndex++)
					{

					}
					/// Process the actual simulation, only if not sleeping/deactivated
					numIslandManifolds = endManifoldIndex-startManifoldIndex;
				}

			}

			if (!islandSleeping)
			{
				callback->processIsland(&m_islandBodies[0],m_islandBodies.size(),startManifold,numIslandManifolds, islandId);
	//			printf("Island callback of size:%d bodies, %d manifolds\n",islandBodies.size(),numIslandManifolds);
			}
			
			if (numIslandManifolds)
			{
				startManifoldIndex = endManifoldIndex;
			}

			m_islandBodies.resize(0);
		}
	} // else if(!splitIslands) 

}